

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O1

void __thiscall
NewEdgeCalculator::calculateProbM(NewEdgeCalculator *this,mapValue *val1,mapValue *val2,double *res)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = val1->prob;
  dVar1 = val2->prob;
  if (val1->base == val2->base) {
    dVar3 = dVar2 * (dVar1 / 3.0);
    dVar2 = (1.0 - dVar2) * (1.0 - dVar1);
  }
  else {
    dVar3 = dVar2 / 3.0;
    dVar2 = (1.0 - dVar2) * (dVar1 / 3.0) + (1.0 - dVar1) * dVar3;
    dVar3 = (dVar3 + dVar3) * (dVar1 / 3.0);
  }
  *res = (dVar2 + dVar3 + 0.0) * *res;
  return;
}

Assistant:

void NewEdgeCalculator::calculateProbM(const AlignmentRecord::mapValue & val1,const AlignmentRecord::mapValue & val2, double& res) const{
    double sum = 0.0;
    if(val1.base==val2.base){
        sum+=(1.0-val1.prob)*(1.0-val2.prob)+(val1.prob)*(val2.prob/3);
    } else  {
        sum+=(1.0-val1.prob)*(val2.prob/3)+(1.0-val2.prob)*(val1.prob/3)+2*(val1.prob/3)*(val2.prob/3);
    }
    res*=sum;
}